

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O0

void * __thiscall
density_tests::UnmovableFastTestAllocator<65536UL>::try_allocate_page
          (UnmovableFastTestAllocator<65536UL> *this,progress_guarantee i_progress_guarantee)

{
  bool bVar1;
  void *i_address;
  void *result;
  progress_guarantee i_progress_guarantee_local;
  UnmovableFastTestAllocator<65536UL> *this_local;
  
  i_address = density::basic_default_allocator<65536UL>::try_allocate_page
                        ((basic_default_allocator<65536UL> *)this,i_progress_guarantee);
  if (i_address != (void *)0x0) {
    LOCK();
    (this->m_living_pages).super___atomic_base<unsigned_long>._M_i =
         (this->m_living_pages).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    LOCK();
    (this->m_total_allocated_pages).super___atomic_base<unsigned_long>._M_i =
         (this->m_total_allocated_pages).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    bVar1 = density::address_is_aligned(i_address,0x10000);
    if (!bVar1) {
      detail::assert_failed<>
                ("density::address_is_aligned(result, page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/test_allocators.h"
                 ,0x172);
    }
  }
  return i_address;
}

Assistant:

void * try_allocate_page(density::progress_guarantee i_progress_guarantee)
        {
            auto const result = Base::try_allocate_page(i_progress_guarantee);
            if (result)
            {
                m_living_pages.fetch_add(1, std::memory_order_relaxed);
                m_total_allocated_pages.fetch_add(1, std::memory_order_relaxed);
                DENSITY_TEST_ASSERT(density::address_is_aligned(result, page_alignment));
            }
            return result;
        }